

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O1

void __thiscall TestMaterial::initializeUniverse(TestMaterial *this)

{
  S_Box *pSVar1;
  S_Sphere *pSVar2;
  S_Superellipsoid *pSVar3;
  S_Point *this_00;
  void *pvVar4;
  S_Cone *this_01;
  STP_BV *pSVar5;
  ostream *poVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  Vector3 position;
  double *local_b8;
  double local_b0;
  double local_a8 [2];
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  double local_38;
  
  if (this->nonSTPBV_ == true) {
    pSVar1 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar1,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar1 = (S_Box *)operator_new(0xa8);
    sch::S_Box::S_Box(pSVar1,0.2,0.2,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar2 = (S_Sphere *)operator_new(0x98);
    local_b8 = (double *)0x3fb999999999999a;
    sch::S_Sphere::S_Sphere(pSVar2,(double *)&local_b8);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar2 = (S_Sphere *)operator_new(0x98);
    local_b8 = (double *)0x3fbeb851eb851eb8;
    sch::S_Sphere::S_Sphere(pSVar2,(double *)&local_b8);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar3,0.25,0.3,0.3,0.9,0.2);
    sch::CD_Scene::addObject((S_Object *)this);
    pSVar3 = (S_Superellipsoid *)operator_new(0xd8);
    sch::S_Superellipsoid::S_Superellipsoid(pSVar3,0.11,0.3,0.14,0.4,0.8);
    sch::CD_Scene::addObject((S_Object *)this);
    this_00 = (S_Point *)operator_new(0x98);
    sch::S_Point::S_Point(this_00);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar4 = operator_new(200);
    local_50 = 0x3fb999999999999a;
    uStack_48 = 0x3fb999999999999a;
    local_40 = 0x3fb999999999999a;
    local_68 = 0xbfb999999999999a;
    uStack_60 = 0xbfb999999999999a;
    local_58 = 0xbfb999999999999a;
    sch::S_Capsule::S_Capsule((S_Capsule *)0x9999999a,pvVar4);
    sch::CD_Scene::addObject((S_Object *)this);
    this_01 = (S_Cone *)operator_new(0xb0);
    local_b8 = (double *)0x3fe0000000000000;
    local_38 = 0.3;
    sch::S_Cone::S_Cone(this_01,(double *)&local_b8,&local_38);
    sch::CD_Scene::addObject((S_Object *)this);
    pvVar4 = operator_new(0xe0);
    local_80 = 0x3fb999999999999a;
    uStack_78 = 0x3fb999999999999a;
    local_70 = 0x3fb999999999999a;
    local_98 = 0xbfb999999999999a;
    uStack_90 = 0xbfb999999999999a;
    local_88 = 0xbfb999999999999a;
    sch::S_Cylinder::S_Cylinder((S_Cylinder *)0x9999999a,pvVar4);
    sch::CD_Scene::addObject((S_Object *)this);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"10 Non-STP BV Objects added to scene",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
    std::ostream::put('H');
    std::ostream::flush();
  }
  pSVar5 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar5);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"sample_stpbv1.txt","");
  (**(code **)(*(long *)pSVar5 + 0x48))(pSVar5,&local_b8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(long)local_a8[0] + 1);
  }
  sch::CD_Scene::addObject((S_Object *)this);
  pSVar5 = (STP_BV *)operator_new(0xe8);
  sch::STP_BV::STP_BV(pSVar5);
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"sample_stpbv2.txt","");
  (**(code **)(*(long *)pSVar5 + 0x48))(pSVar5,&local_b8);
  if (local_b8 != local_a8) {
    operator_delete(local_b8,(long)local_a8[0] + 1);
  }
  sch::CD_Scene::addObject((S_Object *)this);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"2 STP-BVs loaded and added to the scene",0x27);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'H');
  std::ostream::put('H');
  std::ostream::flush();
  lVar7 = *(long *)&this->field_0x8;
  if (*(long *)&this->field_0x10 != lVar7) {
    lVar11 = -3;
    lVar9 = -2;
    uVar12 = 0;
    uVar10 = 0;
    uVar8 = 0;
    do {
      local_b8 = (double *)((double)(long)(lVar9 + (uVar12 / 5) * -5) * 0.2);
      local_b0 = (double)(long)(lVar11 + (uVar10 / 3 & 0xfffffffffffffffe) * -3) *
                 0.8333333333333334 * 0.2;
      local_a8[0] = (double)(long)((uVar10 / 7) * -7 + lVar11) * 0.7142857142857143 * 0.2;
      sch::S_Object::setPosition(*(Vector3T **)(lVar7 + uVar8 * 8));
      uVar8 = uVar8 + 1;
      lVar7 = *(long *)&this->field_0x8;
      lVar11 = lVar11 + 5;
      uVar10 = uVar10 + 5;
      lVar9 = lVar9 + 7;
      uVar12 = uVar12 + 7;
    } while (uVar8 < (ulong)(*(long *)&this->field_0x10 - lVar7 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"A total of ",0xb);
  poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," objects in the scene",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
  std::ostream::put((char)poVar6);
  std::ostream::flush();
  sch::CD_Scene::sceneProximityQuery();
  return;
}

Assistant:

void TestMaterial::initializeUniverse()
{
  if (nonSTPBV_)
  {
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Box(0.2,0.2,0.2));
    sObj.addObject(new S_Sphere(0.1));
    sObj.addObject(new S_Sphere(0.12));

    sObj.addObject(new S_Superellipsoid(.25,.30,.30,0.9,0.2));
    sObj.addObject(new S_Superellipsoid(.11,.30,.14,0.4,0.8));
    sObj.addObject(new S_Point());
    sObj.addObject(new S_Capsule(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));
    sObj.addObject(new S_Cone(0.5,0.3));
    sObj.addObject(new S_Cylinder(Point3(0.1,0.1,0.1),Point3(-0.1,-0.1,-0.1),0.2));

    std::cout << "10 Non-STP BV Objects added to scene" << std::endl;
  }

#ifdef MULTI_OBJECTS_TEST
  {
    bool b=true;
    int i=0;
    do
    {
      std::string s;
      s="";
      std::stringstream istr;
      istr<<std::string("C:/Mehdi/nuage_points/simplifies/testspace/jobj(")<<i<<").txt";


      getline(istr,s);
      std::fstream testfile;
      testfile.open(s.c_str());

      if (testfile.is_open())
      {
        b=true;
        testfile.close();

        //STP_BV stp;
        STP_BV_P stp;
        stp.constructFromFileWithGL(s.c_str());

        stppObjects.push_back(stp);
        //  stpObjects.push_back(stp);
      }
      else
        b=false;

      i++;

      //if (i==8) b=false;


    }
    while(b);

    for (int j=0; j<stppObjects.size(); j++)
    {
      sObj.addObject(&(stppObjects[j]));
    }

    std::cout << "Multi Object loaded and added to the scene" << std::endl;
  }
#else
  {
    STP_BV* s1 = new STP_BV();
    s1->constructFromFileWithGL("sample_stpbv1.txt");
    sObj.addObject(s1);

    STP_BV* s2 = new STP_BV();
    s2->constructFromFileWithGL("sample_stpbv2.txt");
    sObj.addObject(s2);
    std::cout << "2 STP-BVs loaded and added to the scene" << std::endl;
  }
#endif
  for (size_t i=0; i<sObj.size(); i++)
  {
    Vector3 position(
      Scalar(7*i%5)-2.,
      (Scalar(5*i%6)-3.)*(5.0/6.),
      (Scalar(5*i%7)-3.)*(5.0/7.)
    );
    position *= DispersionScale;
    sObj[i]->setPosition(position);
  }

  std::cout << "A total of "<< sObj.size() <<" objects in the scene"<<std::endl;

  DoTest();
}